

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacencyTests.cpp
# Opt level: O2

void __thiscall
glcts::GeometryShaderAdjacencyTests::createGridTriangles
          (GeometryShaderAdjacencyTests *this,AdjacencyTestData *test_data)

{
  uint uVar1;
  AdjacencyGrid *pAVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  AdjacencyGridTriangle *pAVar6;
  AdjacencyGridPoint *pAVar7;
  AdjacencyGridPoint **ppAVar8;
  AdjacencyGridPoint *pAVar9;
  ulong uVar10;
  AdjacencyGridPoint *pAVar11;
  int iVar12;
  AdjacencyGridPoint *pAVar13;
  
  uVar1 = this->m_grid_granulity;
  uVar4 = uVar1 * uVar1 * 2;
  pAVar6 = (AdjacencyGridTriangle *)operator_new__((ulong)uVar4 * 0x30);
  pAVar2 = test_data->m_grid;
  pAVar2->m_triangles = pAVar6;
  pAVar2->m_n_triangles = uVar4;
  ppAVar8 = &pAVar6[1].m_vertex_z_adjacent;
  for (uVar10 = 0; (uVar1 * uVar1 & 0x7fffffff) != uVar10; uVar10 = uVar10 + 1) {
    pAVar9 = pAVar2->m_points;
    iVar5 = (int)((uVar10 & 0xffffffff) / (ulong)uVar1);
    iVar12 = iVar5 * (uVar1 + 1);
    iVar3 = (int)((uVar10 & 0xffffffff) % (ulong)uVar1);
    pAVar11 = pAVar9 + (uint)(iVar12 + iVar3);
    pAVar13 = pAVar9 + (iVar12 + iVar3 + 1);
    iVar5 = (iVar5 + 1) * (uVar1 + 1);
    pAVar7 = pAVar9 + (uint)(iVar3 + iVar5);
    pAVar9 = pAVar9 + (iVar5 + iVar3 + 1);
    ppAVar8[-0xb] = pAVar11;
    ppAVar8[-10] = pAVar13;
    ppAVar8[-9] = pAVar9;
    ppAVar8[-8] = pAVar7;
    ppAVar8[-7] = pAVar7;
    ppAVar8[-6] = pAVar9;
    ((AdjacencyGridTriangle *)(ppAVar8 + -5))->m_vertex_x = pAVar11;
    ppAVar8[-4] = pAVar13;
    ppAVar8[-3] = pAVar13;
    ppAVar8[-2] = pAVar11;
    ppAVar8[-1] = pAVar9;
    *ppAVar8 = pAVar7;
    ppAVar8 = ppAVar8 + 0xc;
  }
  return;
}

Assistant:

void GeometryShaderAdjacencyTests::createGridTriangles(AdjacencyTestData& test_data)
{
	const int	nTrianglesPerQuad = 2;
	unsigned int nTriangles		   = m_grid_granulity * m_grid_granulity * nTrianglesPerQuad;

	test_data.m_grid->m_triangles   = new AdjacencyGridTriangle[nTriangles];
	test_data.m_grid->m_n_triangles = nTriangles;

	for (unsigned int nQuad = 0; nQuad < (nTriangles / nTrianglesPerQuad); ++nQuad)
	{
		unsigned int quadTLX = (nQuad) % m_grid_granulity;
		unsigned int quadTLY = (nQuad) / m_grid_granulity;

		/* Grid is built off points row-by-row. */
		AdjacencyGridPoint* pointTL = test_data.m_grid->m_points + (quadTLY * (m_grid_granulity + 1) + quadTLX);
		AdjacencyGridPoint* pointTR = test_data.m_grid->m_points + (quadTLY * (m_grid_granulity + 1) + quadTLX + 1);
		AdjacencyGridPoint* pointBL = test_data.m_grid->m_points + ((quadTLY + 1) * (m_grid_granulity + 1) + quadTLX);
		AdjacencyGridPoint* pointBR =
			test_data.m_grid->m_points + ((quadTLY + 1) * (m_grid_granulity + 1) + quadTLX + 1);

		/* Note: In many cases, the adjacency data used below is not correct topologically-wise.
		 *       However, since we're not doing any rendering, we're safe as long as unique data
		 *       is used.
		 */
		test_data.m_grid->m_triangles[nQuad * nTrianglesPerQuad + 0].m_vertex_x			 = pointTL;
		test_data.m_grid->m_triangles[nQuad * nTrianglesPerQuad + 0].m_vertex_x_adjacent = pointTR;
		test_data.m_grid->m_triangles[nQuad * nTrianglesPerQuad + 0].m_vertex_y			 = pointBR;
		test_data.m_grid->m_triangles[nQuad * nTrianglesPerQuad + 0].m_vertex_y_adjacent = pointBL;
		test_data.m_grid->m_triangles[nQuad * nTrianglesPerQuad + 0].m_vertex_z			 = pointBL;
		test_data.m_grid->m_triangles[nQuad * nTrianglesPerQuad + 0].m_vertex_z_adjacent = pointBR;

		test_data.m_grid->m_triangles[nQuad * nTrianglesPerQuad + 1].m_vertex_x			 = pointTL;
		test_data.m_grid->m_triangles[nQuad * nTrianglesPerQuad + 1].m_vertex_x_adjacent = pointTR;
		test_data.m_grid->m_triangles[nQuad * nTrianglesPerQuad + 1].m_vertex_y			 = pointTR;
		test_data.m_grid->m_triangles[nQuad * nTrianglesPerQuad + 1].m_vertex_y_adjacent = pointTL;
		test_data.m_grid->m_triangles[nQuad * nTrianglesPerQuad + 1].m_vertex_z			 = pointBR;
		test_data.m_grid->m_triangles[nQuad * nTrianglesPerQuad + 1].m_vertex_z_adjacent = pointBL;
	}
}